

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::ArrayCpyExpr::ArrayCpyExpr
          (ArrayCpyExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *valueExpr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lengthExpr)

{
  bool bVar1;
  pointer pEVar2;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lengthExpr_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *valueExpr_local;
  Position *pos_local;
  Lexer *lexer_local;
  ArrayCpyExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_ARRCPY,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ArrayCpyExpr_0017fa38;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->valueExpr,valueExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->lengthExpr,lengthExpr);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->valueExpr);
  if (!bVar1) {
    __assert_fail("!!this->valueExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x3a3,
                  "pfederc::ArrayCpyExpr::ArrayCpyExpr(const Lexer &, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->lengthExpr);
  if (!bVar1) {
    __assert_fail("!!this->lengthExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x3a4,
                  "pfederc::ArrayCpyExpr::ArrayCpyExpr(const Lexer &, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->valueExpr);
  Expr::setParent(pEVar2,&this->super_Expr);
  pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->lengthExpr);
  Expr::setParent(pEVar2,&this->super_Expr);
  return;
}

Assistant:

ArrayCpyExpr::ArrayCpyExpr(const Lexer &lexer, const Position &pos,
     std::unique_ptr<Expr> &&valueExpr,
     std::unique_ptr<Expr> &&lengthExpr) noexcept
     : Expr(lexer, ExprType::EXPR_ARRCPY, pos), valueExpr(std::move(valueExpr)),
       lengthExpr(std::move(lengthExpr)) {
  assert(!!this->valueExpr);
  assert(!!this->lengthExpr);

  this->valueExpr->setParent(this);
  this->lengthExpr->setParent(this);
}